

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

Test * GraphTestDyndepFileError::Create(void)

{
  GraphTest *this;
  
  this = (GraphTest *)operator_new(0x228);
  GraphTest::GraphTest(this);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_001d4c88;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(GraphTest, DyndepFileError) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out: r || dd\n"
"  dyndep = dd\n"
  );
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
  );

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("out"), &err));
  ASSERT_EQ("'out' not mentioned in its dyndep file 'dd'", err);
}